

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

convertible_to_iterator __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
::erase(sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
        *this,const_iterator to_erase)

{
  char cVar1;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_3 *paVar2;
  EntryPointer current;
  
  (to_erase.current)->distance_from_desired = -1;
  this->num_elements = this->num_elements - 1;
  for (paVar2 = &to_erase.current[1].field_1;
      cVar1 = ((sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*> *)(paVar2 + -1))->
              distance_from_desired, '\0' < cVar1; paVar2 = paVar2 + 2) {
    paVar2[-2] = *paVar2;
    *(char *)(paVar2 + -3) = cVar1 + -1;
    *(undefined1 *)(paVar2 + -1) = 0xff;
  }
  return (convertible_to_iterator)to_erase.current;
}

Assistant:

convertible_to_iterator erase(const_iterator to_erase)
    {
        EntryPointer current = to_erase.current;
        current->destroy_value();
        --num_elements;
        for (EntryPointer next = current + ptrdiff_t(1); !next->is_at_desired_position(); ++current, ++next)
        {
            current->emplace(next->distance_from_desired - 1, std::move(next->value));
            next->destroy_value();
        }
        return { to_erase.current };
    }